

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::getTimeZoneID
          (TimeZoneFormat *this,MatchInfoCollection *matches,int32_t idx,UnicodeString *tzID)

{
  UBool UVar1;
  UnicodeString mzID;
  UChar mzIDBuf [32];
  
  UVar1 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(matches,idx,tzID);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString(&mzID,mzIDBuf,0,0x20);
    UVar1 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt(matches,idx,&mzID);
    if (UVar1 != '\0') {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                (this->fTimeZoneNames,&mzID,this->fTargetRegion,tzID);
    }
    UnicodeString::~UnicodeString(&mzID);
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::getTimeZoneID(const TimeZoneNames::MatchInfoCollection* matches, int32_t idx, UnicodeString& tzID) const {
    if (!matches->getTimeZoneIDAt(idx, tzID)) {
        UChar mzIDBuf[32];
        UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
        if (matches->getMetaZoneIDAt(idx, mzID)) {
            fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, tzID);
        }
    }
    return tzID;
}